

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  ulong uVar1;
  internal *end;
  internal *piVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *pfVar3;
  size_t sVar4;
  wchar_t wVar5;
  internal *piVar6;
  internal *piVar7;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  internal *piVar8;
  basic_buffer<wchar_t> *c;
  bool bVar9;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  end = this + (long)format_str.data_ * 4;
  piVar8 = this;
  do {
    if (piVar8 == end) {
      return;
    }
    piVar7 = piVar8;
    if (*(wchar_t *)piVar8 == L'{') {
LAB_001f95c4:
      if (piVar8 != piVar7) {
        do {
          bVar9 = piVar8 != piVar7;
          piVar6 = piVar8;
          if (bVar9) {
            wVar5 = *(wchar_t *)piVar8;
            while (wVar5 != L'}') {
              piVar6 = piVar6 + 4;
              bVar9 = piVar6 != piVar7;
              if (piVar6 == piVar7) goto LAB_001f9600;
              wVar5 = *(wchar_t *)piVar6;
            }
            bVar9 = true;
          }
LAB_001f9600:
          if (bVar9) {
            piVar2 = piVar6 + 4;
            if ((piVar2 == piVar7) || (*(wchar_t *)piVar2 != L'}')) goto LAB_001f97bb;
            this = (internal *)this_00;
            format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar2);
            piVar8 = piVar6 + 8;
          }
          else {
            this = (internal *)this_00;
            format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar7);
          }
        } while (bVar9);
      }
      piVar7 = piVar7 + 4;
      if (piVar7 == end) {
        error_handler::on_error((error_handler *)this,"invalid format string");
      }
      if ((char)*(wchar_t *)piVar7 == '}') {
        basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001f9679:
        this = (internal *)this_00;
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar7);
      }
      else if (*(wchar_t *)piVar7 == L'{') {
        pfVar3 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  *)(this_00->context).
                    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                    .out_.container;
        sVar4 = (pfVar3->context).
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                .parse_context_.format_str_.size_;
        uVar1 = sVar4 + 1;
        if (*(ulong *)&(pfVar3->context).
                       super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                       .parse_context_.next_arg_id_ < uVar1) {
          this = (internal *)pfVar3;
          (*(code *)**(undefined8 **)&pfVar3->field_0x0)(pfVar3,uVar1);
        }
        (pfVar3->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
        .parse_context_.format_str_.size_ = uVar1;
        (pfVar3->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
        .parse_context_.format_str_.data_[sVar4] = *(wchar_t *)piVar7;
        (this_00->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
        .out_.container = (basic_buffer<wchar_t> *)pfVar3;
      }
      else {
        piVar8 = piVar7;
        local_58._0_8_ = this_00;
        piVar7 = (internal *)
                 parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar7,(wchar_t *)end,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                             *)&local_58.string);
        if (piVar7 == end) {
          wVar5 = L'\0';
        }
        else {
          wVar5 = *(wchar_t *)piVar7;
        }
        if (wVar5 != L':') {
          if (wVar5 != L'}') {
            error_handler::on_error((error_handler *)piVar8,"missing \'}\' in format string");
          }
          goto LAB_001f9679;
        }
        this = (internal *)this_00;
        piVar7 = (internal *)
                 format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ::on_format_specs(this_00,(wchar_t *)(piVar7 + 4),(wchar_t *)end);
        if ((piVar7 == end) || (*(wchar_t *)piVar7 != L'}')) {
          error_handler::on_error((error_handler *)this,"unknown format specifier");
        }
      }
      piVar8 = piVar7 + 4;
      bVar9 = true;
    }
    else {
      bVar9 = true;
      wVar5 = *(wchar_t *)piVar8;
      while (wVar5 != L'{') {
        piVar7 = piVar7 + 4;
        bVar9 = piVar7 != end;
        if (piVar7 == end) break;
        wVar5 = *(wchar_t *)piVar7;
      }
      piVar6 = piVar8;
      if (bVar9) goto LAB_001f95c4;
      do {
        bVar9 = piVar6 != end;
        piVar7 = piVar6;
        if (bVar9) {
          wVar5 = *(wchar_t *)piVar6;
          while (wVar5 != L'}') {
            piVar7 = piVar7 + 4;
            bVar9 = piVar7 != end;
            if (piVar7 == end) goto LAB_001f9701;
            wVar5 = *(wchar_t *)piVar7;
          }
          bVar9 = true;
        }
LAB_001f9701:
        if (bVar9) {
          piVar2 = piVar7 + 4;
          if ((piVar2 == end) || (*(wchar_t *)piVar2 != L'}')) {
LAB_001f97bb:
            error_handler::on_error((error_handler *)this,"unmatched \'}\' in format string");
          }
          this = (internal *)this_00;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar6,(wchar_t *)piVar2);
          piVar6 = piVar7 + 8;
        }
        else {
          this = (internal *)this_00;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar6,(wchar_t *)end);
        }
      } while (bVar9);
      bVar9 = false;
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}